

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall t_py_generator::generate_service_client(t_py_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *out;
  int *piVar1;
  int iVar2;
  long lVar3;
  t_type *returntype;
  long lVar4;
  char cVar5;
  ostream *poVar6;
  char *pcVar7;
  t_struct *this_00;
  string *psVar8;
  byte bVar9;
  _Alloc_hider _Var10;
  long *plVar11;
  string argsname;
  string funname;
  string resultname;
  string messageType;
  t_function recv_function;
  t_struct noargs;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_client;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  undefined1 local_518 [160];
  string local_478;
  t_struct local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0 [32];
  string local_290 [32];
  string local_270;
  string local_250;
  string local_230 [32];
  string local_210;
  string local_1f0;
  string local_1d0 [32];
  string local_1b0;
  string local_190;
  string local_170 [32];
  string local_150;
  string local_130 [32];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_390,"",(allocator *)&local_458);
  std::__cxx11::string::string(local_2b0,"",(allocator *)&local_458);
  if (tservice->extends_ == (t_service *)0x0) {
    if ((this->gen_zope_interface_ == true) &&
       ((this->gen_newstyle_ != false || (this->gen_dynamic_ == true)))) {
      std::__cxx11::string::assign((char *)local_2b0);
    }
  }
  else {
    type_name_abi_cxx11_((string *)&local_458,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_390,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    if (this->gen_zope_interface_ == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518,
                     "(",&local_390);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_458
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518
                     ,".Client)");
      std::__cxx11::string::operator=(local_2b0,(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      this_00 = (t_struct *)local_518;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_458
                     ,&local_390,".Client, ");
      this_00 = &local_458;
      std::__cxx11::string::operator=(local_2b0,(string *)this_00);
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  out = &this->f_service_;
  poVar6 = std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  if (this->gen_zope_interface_ == true) {
    poVar6 = std::operator<<((ostream *)out,"@implementer(Iface)");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,"class Client");
    poVar6 = std::operator<<(poVar6,local_2b0);
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar6 = std::operator<<((ostream *)out,"class Client(");
    poVar6 = std::operator<<(poVar6,local_2b0);
    poVar6 = std::operator<<(poVar6,"Iface):");
  }
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  generate_python_docstring(this,(ostream *)out,(t_doc *)tservice);
  if (this->gen_twisted_ == true) {
    t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
    poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,"def __init__(self, transport, oprot_factory):");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  else if (this->gen_tornado_ == true) {
    t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
    poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,
                             "def __init__(self, transport, iprot_factory, oprot_factory=None):");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
    poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,"def __init__(self, iprot, oprot=None):");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_458);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  if (local_390._M_string_length == 0) {
    if (this->gen_twisted_ == false) {
      if (this->gen_tornado_ == true) {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"self._transport = transport");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)local_518);
        poVar6 = std::operator<<(poVar6,"self._iprot_factory = iprot_factory");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_598,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_598);
        poVar6 = std::operator<<(poVar6,
                                 "self._oprot_factory = (oprot_factory if oprot_factory is not None"
                                );
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_5b8,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_5b8);
        poVar6 = std::operator<<(poVar6,"                       else iprot_factory)");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_538,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_538);
        poVar6 = std::operator<<(poVar6,"self._seqid = 0");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_558,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_558);
        poVar6 = std::operator<<(poVar6,"self._reqs = {}");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_578,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_578);
        poVar6 = std::operator<<(poVar6,
                                 "self._transport.io_loop.spawn_callback(self._start_receiving)");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_558);
      }
      else {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"self._iprot = self._oprot = iprot");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)local_518);
        poVar6 = std::operator<<(poVar6,"if oprot is not None:");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_598,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_598);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_5b8,this);
        poVar6 = std::operator<<(poVar6,(string *)&local_5b8);
        poVar6 = std::operator<<(poVar6,"self._oprot = oprot");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_538,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_538);
        poVar6 = std::operator<<(poVar6,"self._seqid = 0");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_538);
    }
    else {
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,"self._transport = transport");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)local_518);
      poVar6 = std::operator<<(poVar6,"self._oprot_factory = oprot_factory");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_598,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)&local_598);
      poVar6 = std::operator<<(poVar6,"self._seqid = 0");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_5b8,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)&local_5b8);
      poVar6 = std::operator<<(poVar6,"self._reqs = {}");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)local_518);
  }
  else if (this->gen_twisted_ == false) {
    if (this->gen_tornado_ == true) {
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,(string *)&local_390);
      poVar6 = std::operator<<(poVar6,
                               ".Client.__init__(self, transport, iprot_factory, oprot_factory)");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,(string *)&local_390);
      poVar6 = std::operator<<(poVar6,".Client.__init__(self, iprot, oprot)");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
    poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,(string *)&local_390);
    poVar6 = std::operator<<(poVar6,".Client.__init__(self, transport, oprot_factory)");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_458);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  if ((this->gen_tornado_ == true) && (local_390._M_string_length == 0)) {
    poVar6 = std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,"@gen.engine");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)local_518);
    poVar6 = std::operator<<(poVar6,"def _start_receiving(self):");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_518);
    std::__cxx11::string::~string((string *)&local_458);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
    poVar6 = std::operator<<(poVar6,"while True:");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
    poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,"try:");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)local_518);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_598,this);
    poVar6 = std::operator<<(poVar6,(string *)&local_598);
    poVar6 = std::operator<<(poVar6,"frame = yield self._transport.readFrame()");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_5b8,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_5b8);
    poVar6 = std::operator<<(poVar6,"except TTransport.TTransportException as e:");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_538,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_538);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_558,this);
    poVar6 = std::operator<<(poVar6,(string *)&local_558);
    poVar6 = std::operator<<(poVar6,"for future in self._reqs.values():");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_578,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_578);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_518 + 0xa0,this);
    poVar6 = std::operator<<(poVar6,(string *)(local_518 + 0xa0));
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_2f0,this);
    poVar6 = std::operator<<(poVar6,(string *)&local_2f0);
    poVar6 = std::operator<<(poVar6,"future.set_exception(e)");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_310,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_310);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_330,this);
    poVar6 = std::operator<<(poVar6,(string *)&local_330);
    poVar6 = std::operator<<(poVar6,"self._reqs = {}");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_350,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_350);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_370,this);
    poVar6 = std::operator<<(poVar6,(string *)&local_370);
    poVar6 = std::operator<<(poVar6,"return");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_2d0);
    poVar6 = std::operator<<(poVar6,"tr = TTransport.TMemoryBuffer(frame)");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_70);
    poVar6 = std::operator<<(poVar6,"iprot = self._iprot_factory.getProtocol(tr)");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_90);
    poVar6 = std::operator<<(poVar6,"(fname, mtype, rseqid) = iprot.readMessageBegin()");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_b0);
    poVar6 = std::operator<<(poVar6,"method = getattr(self, \'recv_\' + fname)");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_d0,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_d0);
    poVar6 = std::operator<<(poVar6,"future = self._reqs.pop(rseqid, None)");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_f0);
    poVar6 = std::operator<<(poVar6,"if not future:");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_110,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_110);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_130,this);
    poVar6 = std::operator<<(poVar6,local_130);
    poVar6 = std::operator<<(poVar6,"# future has already been discarded");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_150,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_150);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_170,this);
    poVar6 = std::operator<<(poVar6,local_170);
    poVar6 = std::operator<<(poVar6,"continue");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_190,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_190);
    poVar6 = std::operator<<(poVar6,"try:");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_1b0);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1d0,this);
    poVar6 = std::operator<<(poVar6,local_1d0);
    poVar6 = std::operator<<(poVar6,"result = method(iprot, mtype, rseqid)");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1f0,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_1f0);
    poVar6 = std::operator<<(poVar6,"except Exception as e:");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_210,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_210);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_230,this);
    poVar6 = std::operator<<(poVar6,local_230);
    poVar6 = std::operator<<(poVar6,"future.set_exception(e)");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_250,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_250);
    poVar6 = std::operator<<(poVar6,"else:");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_270,&this->super_t_generator);
    poVar6 = std::operator<<(poVar6,(string *)&local_270);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_290,this);
    poVar6 = std::operator<<(poVar6,local_290);
    poVar6 = std::operator<<(poVar6,"future.set_result(result)");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)(local_518 + 0xa0));
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)local_518);
    std::__cxx11::string::~string((string *)&local_458);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -2;
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_2d0,&tservice->functions_
            );
  _Var10._M_p = local_2d0._M_dataplus._M_p;
  do {
    if (_Var10._M_p == (pointer)local_2d0._M_string_length) {
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
                ((_Vector_base<t_function_*,_std::allocator<t_function_*>_> *)&local_2d0);
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::string::~string((string *)&local_390);
      return;
    }
    lVar3 = *(long *)(*(long *)_Var10._M_p + 0x88);
    std::__cxx11::string::string((string *)&local_598,(string *)(*(long *)_Var10._M_p + 0x68));
    std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
    poVar6 = std::operator<<(poVar6,"def ");
    function_signature_abi_cxx11_((string *)&local_458,this,*(t_function **)_Var10._M_p,false);
    poVar6 = std::operator<<(poVar6,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,":");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_458);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    generate_python_docstring(this,(ostream *)out,*(t_function **)_Var10._M_p);
    if (this->gen_twisted_ == true) {
      poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      poVar6 = std::operator<<(poVar6,"seqid = self._seqid = self._seqid + 1");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      poVar6 = std::operator<<(poVar6,"self._reqs[seqid] = defer.Deferred()");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      poVar6 = std::operator<<(poVar6,"d = defer.maybeDeferred(self.send_");
      std::operator<<(poVar6,(string *)&local_598);
    }
    else {
      if (this->gen_tornado_ == true) {
        poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
        poVar6 = std::operator<<(poVar6,"self._seqid += 1");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        if (*(char *)(*(long *)_Var10._M_p + 0x99) == '\0') {
          poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
          poVar6 = std::operator<<(poVar6,"future = self._reqs[self._seqid] = concurrent.Future()");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        }
      }
      poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      poVar6 = std::operator<<(poVar6,"self.send_");
      poVar6 = std::operator<<(poVar6,(string *)&local_598);
      std::operator<<(poVar6,"(");
    }
    bVar9 = this->gen_twisted_ ^ 1;
    for (plVar11 = *(long **)(lVar3 + 0x88); plVar11 != *(long **)(lVar3 + 0x90);
        plVar11 = plVar11 + 1) {
      if ((bVar9 & 1) == 0) {
        std::operator<<((ostream *)out,", ");
      }
      else {
        bVar9 = 0;
      }
      std::operator<<((ostream *)out,(string *)(*plVar11 + 0x68));
    }
    poVar6 = std::operator<<((ostream *)out,")");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    if ((*(char *)(*(long *)_Var10._M_p + 0x99) == '\0') && (this->gen_twisted_ == false)) {
      if (this->gen_tornado_ == true) {
        poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
        pcVar7 = "return future";
      }
      else {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        std::operator<<((ostream *)out,(string *)&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        cVar5 = (**(code **)(**(long **)(*(long *)_Var10._M_p + 0x60) + 0x20))();
        if (cVar5 == '\0') {
          std::operator<<((ostream *)out,"return ");
        }
        poVar6 = std::operator<<((ostream *)out,"self.recv_");
        poVar6 = std::operator<<(poVar6,(string *)&local_598);
        pcVar7 = "()";
      }
      poVar6 = std::operator<<(poVar6,pcVar7);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    iVar2 = (this->super_t_generator).indent_;
    (this->super_t_generator).indent_ = iVar2 + -1;
    if (this->gen_twisted_ == true) {
      (this->super_t_generator).indent_ = iVar2;
      poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      poVar6 = std::operator<<(poVar6,"d.addCallbacks(");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,"callback=self.cb_send_");
      poVar6 = std::operator<<(poVar6,(string *)&local_598);
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)local_518);
      poVar6 = std::operator<<(poVar6,"callbackArgs=(seqid,),");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_5b8,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)&local_5b8);
      poVar6 = std::operator<<(poVar6,"errback=self.eb_send_");
      poVar6 = std::operator<<(poVar6,(string *)&local_598);
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_538,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)&local_538);
      poVar6 = std::operator<<(poVar6,"errbackArgs=(seqid,))");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)local_518);
      std::__cxx11::string::~string((string *)&local_458);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      poVar6 = std::operator<<(poVar6,"return d");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
      poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      poVar6 = std::operator<<(poVar6,"def cb_send_");
      poVar6 = std::operator<<(poVar6,(string *)&local_598);
      poVar6 = std::operator<<(poVar6,"(self, _, seqid):");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      if (*(char *)(*(long *)_Var10._M_p + 0x99) == '\x01') {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"d = self._reqs.pop(seqid)");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)local_518);
        poVar6 = std::operator<<(poVar6,"d.callback(None)");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_5b8,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_5b8);
        poVar6 = std::operator<<(poVar6,"return d");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_5b8);
        std::__cxx11::string::~string((string *)local_518);
      }
      else {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"return self._reqs[seqid]");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_458);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
      poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
      poVar6 = std::operator<<(poVar6,"def eb_send_");
      poVar6 = std::operator<<(poVar6,(string *)&local_598);
      poVar6 = std::operator<<(poVar6,"(self, f, seqid):");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,"d = self._reqs.pop(seqid)");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)local_518);
      poVar6 = std::operator<<(poVar6,"d.errback(f)");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_5b8,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)&local_5b8);
      poVar6 = std::operator<<(poVar6,"return d");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)local_518);
      std::__cxx11::string::~string((string *)&local_458);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
    }
    std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent(&this->super_t_generator,(ostream *)out);
    poVar6 = std::operator<<(poVar6,"def send_");
    function_signature_abi_cxx11_((string *)&local_458,this,*(t_function **)_Var10._M_p,false);
    poVar6 = std::operator<<(poVar6,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,":");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_458);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    std::operator+(&local_5b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)_Var10._M_p + 0x68),"_args");
    pcVar7 = "TMessageType.CALL";
    if (*(char *)(*(long *)_Var10._M_p + 0x99) != '\0') {
      pcVar7 = "TMessageType.ONEWAY";
    }
    std::__cxx11::string::string((string *)&local_538,pcVar7,(allocator *)&local_458);
    if ((this->gen_twisted_ == false) && (this->gen_tornado_ != true)) {
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,"self._oprot.writeMessageBegin(\'");
      poVar6 = std::operator<<(poVar6,(string *)(*(long *)_Var10._M_p + 0x68));
      poVar6 = std::operator<<(poVar6,"\', ");
      poVar6 = std::operator<<(poVar6,(string *)&local_538);
      poVar6 = std::operator<<(poVar6,", self._seqid)");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,"oprot = self._oprot_factory.getProtocol(self._transport)");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)local_518);
      poVar6 = std::operator<<(poVar6,"oprot.writeMessageBegin(\'");
      poVar6 = std::operator<<(poVar6,(string *)(*(long *)_Var10._M_p + 0x68));
      poVar6 = std::operator<<(poVar6,"\', ");
      poVar6 = std::operator<<(poVar6,(string *)&local_538);
      poVar6 = std::operator<<(poVar6,", self._seqid)");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_518);
    }
    std::__cxx11::string::~string((string *)&local_458);
    t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
    poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
    poVar6 = std::operator<<(poVar6,"args = ");
    poVar6 = std::operator<<(poVar6,(string *)&local_5b8);
    poVar6 = std::operator<<(poVar6,"()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_458);
    for (plVar11 = *(long **)(lVar3 + 0x88); plVar11 != *(long **)(lVar3 + 0x90);
        plVar11 = plVar11 + 1) {
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,"args.");
      poVar6 = std::operator<<(poVar6,(string *)(*plVar11 + 0x68));
      poVar6 = std::operator<<(poVar6," = ");
      poVar6 = std::operator<<(poVar6,(string *)(*plVar11 + 0x68));
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_458);
    }
    if ((this->gen_twisted_ == false) && (this->gen_tornado_ != true)) {
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,"args.write(self._oprot)");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)local_518);
      poVar6 = std::operator<<(poVar6,"self._oprot.writeMessageEnd()");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_558,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)&local_558);
      poVar6 = std::operator<<(poVar6,"self._oprot.trans.flush()");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,"args.write(oprot)");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)local_518);
      poVar6 = std::operator<<(poVar6,"oprot.writeMessageEnd()");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_558,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)&local_558);
      poVar6 = std::operator<<(poVar6,"oprot.trans.flush()");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)local_518);
    std::__cxx11::string::~string((string *)&local_458);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    if (*(char *)(*(long *)_Var10._M_p + 0x99) == '\0') {
      std::operator+(&local_558,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)_Var10._M_p + 0x68),"_result");
      std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
      if ((this->gen_twisted_ == false) && (this->gen_tornado_ != true)) {
        t_struct::t_struct(&local_458,(this->super_t_generator).program_);
        returntype = *(t_type **)(*(long *)_Var10._M_p + 0x60);
        std::__cxx11::string::string((string *)&local_578,"recv_",(allocator *)(local_518 + 0xa0));
        std::operator+(&local_50,&local_578,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)_Var10._M_p + 0x68));
        t_function::t_function((t_function *)local_518,returntype,&local_50,&local_458,false);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_578);
        t_generator::indent_abi_cxx11_(&local_578,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_578);
        poVar6 = std::operator<<(poVar6,"def ");
        function_signature_abi_cxx11_
                  ((string *)(local_518 + 0xa0),this,(t_function *)local_518,false);
        poVar6 = std::operator<<(poVar6,(string *)(local_518 + 0xa0));
        poVar6 = std::operator<<(poVar6,":");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)(local_518 + 0xa0));
        std::__cxx11::string::~string((string *)&local_578);
        t_function::~t_function((t_function *)local_518);
        t_struct::~t_struct(&local_458);
      }
      else {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"def recv_");
        poVar6 = std::operator<<(poVar6,(string *)(*(long *)_Var10._M_p + 0x68));
        poVar6 = std::operator<<(poVar6,"(self, iprot, mtype, rseqid):");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_458);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      if (this->gen_twisted_ == true) {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"d = self._reqs.pop(rseqid)");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
LAB_002872e5:
        std::__cxx11::string::~string((string *)&local_458);
      }
      else if (this->gen_tornado_ == false) {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"iprot = self._iprot");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)local_518);
        poVar6 = std::operator<<(poVar6,"(fname, mtype, rseqid) = iprot.readMessageBegin()");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_518);
        goto LAB_002872e5;
      }
      t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
      poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
      poVar6 = std::operator<<(poVar6,"if mtype == TMessageType.EXCEPTION:");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_((string *)local_518,&this->super_t_generator);
      poVar6 = std::operator<<(poVar6,(string *)local_518);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_578);
      poVar6 = std::operator<<(poVar6,(string *)&local_578);
      poVar6 = std::operator<<(poVar6,"x = TApplicationException()");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)local_518);
      std::__cxx11::string::~string((string *)&local_458);
      if (this->gen_twisted_ == true) {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])((string *)local_518);
        poVar6 = std::operator<<(poVar6,(string *)local_518);
        poVar6 = std::operator<<(poVar6,"x.read(iprot)");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_578,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_578);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])((string *)(local_518 + 0xa0));
        poVar6 = std::operator<<(poVar6,(string *)(local_518 + 0xa0));
        poVar6 = std::operator<<(poVar6,"iprot.readMessageEnd()");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_2f0,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_2f0);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_310);
        poVar6 = std::operator<<(poVar6,(string *)&local_310);
        poVar6 = std::operator<<(poVar6,"return d.errback(x)");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_330,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_330);
        poVar6 = std::operator<<(poVar6,"result = ");
        poVar6 = std::operator<<(poVar6,(string *)&local_558);
        poVar6 = std::operator<<(poVar6,"()");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_350,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_350);
        poVar6 = std::operator<<(poVar6,"result.read(iprot)");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_370,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_370);
        poVar6 = std::operator<<(poVar6,"iprot.readMessageEnd()");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      else {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])((string *)local_518);
        poVar6 = std::operator<<(poVar6,(string *)local_518);
        poVar6 = std::operator<<(poVar6,"x.read(iprot)");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_578,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_578);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])((string *)(local_518 + 0xa0));
        poVar6 = std::operator<<(poVar6,(string *)(local_518 + 0xa0));
        poVar6 = std::operator<<(poVar6,"iprot.readMessageEnd()");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_2f0,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_2f0);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_310);
        poVar6 = std::operator<<(poVar6,(string *)&local_310);
        poVar6 = std::operator<<(poVar6,"raise x");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_330,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_330);
        poVar6 = std::operator<<(poVar6,"result = ");
        poVar6 = std::operator<<(poVar6,(string *)&local_558);
        poVar6 = std::operator<<(poVar6,"()");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_350,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_350);
        poVar6 = std::operator<<(poVar6,"result.read(iprot)");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_370,&this->super_t_generator);
        poVar6 = std::operator<<(poVar6,(string *)&local_370);
        poVar6 = std::operator<<(poVar6,"iprot.readMessageEnd()");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)(local_518 + 0xa0));
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)local_518);
      std::__cxx11::string::~string((string *)&local_458);
      cVar5 = (**(code **)(**(long **)(*(long *)_Var10._M_p + 0x60) + 0x20))();
      if (cVar5 == '\0') {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"if result.success is not None:");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_458);
        if (this->gen_twisted_ == true) {
          t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
          poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])((string *)local_518);
          poVar6 = std::operator<<(poVar6,(string *)local_518);
          poVar6 = std::operator<<(poVar6,"return d.callback(result.success)");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        }
        else {
          t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
          poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])((string *)local_518);
          poVar6 = std::operator<<(poVar6,(string *)local_518);
          poVar6 = std::operator<<(poVar6,"return result.success");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        }
        std::__cxx11::string::~string((string *)local_518);
        std::__cxx11::string::~string((string *)&local_458);
      }
      lVar3 = *(long *)(*(long *)_Var10._M_p + 0x90);
      for (plVar11 = *(long **)(lVar3 + 0x88); plVar11 != *(long **)(lVar3 + 0x90);
          plVar11 = plVar11 + 1) {
        lVar4 = *plVar11;
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"if result.");
        psVar8 = (string *)(lVar4 + 0x68);
        poVar6 = std::operator<<(poVar6,psVar8);
        poVar6 = std::operator<<(poVar6," is not None:");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_458);
        if (this->gen_twisted_ == true) {
          t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
          poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])((string *)local_518);
          poVar6 = std::operator<<(poVar6,(string *)local_518);
          poVar6 = std::operator<<(poVar6,"return d.errback(result.");
          poVar6 = std::operator<<(poVar6,psVar8);
          poVar6 = std::operator<<(poVar6,")");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        }
        else {
          t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
          poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])((string *)local_518);
          poVar6 = std::operator<<(poVar6,(string *)local_518);
          poVar6 = std::operator<<(poVar6,"raise result.");
          poVar6 = std::operator<<(poVar6,psVar8);
          poVar6 = std::operator<<(poVar6,"");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        }
        std::__cxx11::string::~string((string *)local_518);
        std::__cxx11::string::~string((string *)&local_458);
      }
      cVar5 = (**(code **)(**(long **)(*(long *)_Var10._M_p + 0x60) + 0x20))();
      if (cVar5 == '\0') {
        if (this->gen_twisted_ == false) {
          t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
          poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
          poVar6 = std::operator<<(poVar6,
                                   "raise TApplicationException(TApplicationException.MISSING_RESULT, \""
                                  );
          poVar6 = std::operator<<(poVar6,(string *)(*(long *)_Var10._M_p + 0x68));
          poVar6 = std::operator<<(poVar6," failed: unknown result\")");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        }
        else {
          t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
          poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
          poVar6 = std::operator<<(poVar6,
                                   "return d.errback(TApplicationException(TApplicationException.MISSING_RESULT, \""
                                  );
          poVar6 = std::operator<<(poVar6,(string *)(*(long *)_Var10._M_p + 0x68));
          poVar6 = std::operator<<(poVar6," failed: unknown result\"))");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        }
      }
      else if (this->gen_twisted_ == false) {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"return");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      else {
        t_generator::indent_abi_cxx11_((string *)&local_458,&this->super_t_generator);
        poVar6 = std::operator<<((ostream *)out,(string *)&local_458);
        poVar6 = std::operator<<(poVar6,"return d.callback(None)");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_458);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      std::__cxx11::string::~string((string *)&local_558);
    }
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_598);
    _Var10._M_p = _Var10._M_p + 8;
  } while( true );
}

Assistant:

void t_py_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    if (gen_zope_interface_) {
      extends_client = "(" + extends + ".Client)";
    } else {
      extends_client = extends + ".Client, ";
    }
  } else {
    if (gen_zope_interface_ && (gen_newstyle_ || gen_dynamic_)) {
      extends_client = "(object)";
    }
  }

  f_service_ << endl << endl;

  if (gen_zope_interface_) {
    f_service_ << "@implementer(Iface)" << endl
               << "class Client" << extends_client << ":" << endl
               << endl;
  } else {
    f_service_ << "class Client(" << extends_client << "Iface):" << endl;
  }
  indent_up();
  generate_python_docstring(f_service_, tservice);

  // Constructor function
  if (gen_twisted_) {
    f_service_ << indent() << "def __init__(self, transport, oprot_factory):" << endl;
  } else if (gen_tornado_) {
    f_service_ << indent()
               << "def __init__(self, transport, iprot_factory, oprot_factory=None):" << endl;
  } else {
    f_service_ << indent() << "def __init__(self, iprot, oprot=None):" << endl;
  }
  indent_up();
  if (extends.empty()) {
    if (gen_twisted_) {
      f_service_ << indent() << "self._transport = transport" << endl
                 << indent() << "self._oprot_factory = oprot_factory" << endl
                 << indent() << "self._seqid = 0" << endl
                 << indent() << "self._reqs = {}" << endl;
    } else if (gen_tornado_) {
      f_service_ << indent() << "self._transport = transport" << endl
                 << indent() << "self._iprot_factory = iprot_factory" << endl
                 << indent() << "self._oprot_factory = (oprot_factory if oprot_factory is not None"
                 << endl
                 << indent() << "                       else iprot_factory)" << endl
                 << indent() << "self._seqid = 0" << endl
                 << indent() << "self._reqs = {}" << endl
                 << indent() << "self._transport.io_loop.spawn_callback(self._start_receiving)"
                 << endl;
    } else {
      f_service_ << indent() << "self._iprot = self._oprot = iprot" << endl
                 << indent() << "if oprot is not None:" << endl
                 << indent() << indent_str() << "self._oprot = oprot" << endl
                 << indent() << "self._seqid = 0" << endl;
    }
  } else {
    if (gen_twisted_) {
      f_service_ << indent() << extends
                 << ".Client.__init__(self, transport, oprot_factory)" << endl;
    } else if (gen_tornado_) {
      f_service_ << indent() << extends
                 << ".Client.__init__(self, transport, iprot_factory, oprot_factory)" << endl;
    } else {
      f_service_ << indent() << extends << ".Client.__init__(self, iprot, oprot)" << endl;
    }
  }
  indent_down();

  if (gen_tornado_ && extends.empty()) {
    f_service_ << endl <<
      indent() << "@gen.engine" << endl <<
      indent() << "def _start_receiving(self):" << endl;
    indent_up();
    indent(f_service_) << "while True:" << endl;
    indent_up();
    f_service_ << indent() << "try:" << endl
               << indent() << indent_str() << "frame = yield self._transport.readFrame()" << endl
               << indent() << "except TTransport.TTransportException as e:" << endl
               << indent() << indent_str() << "for future in self._reqs.values():" << endl
               << indent() << indent_str() << indent_str() << "future.set_exception(e)" << endl
               << indent() << indent_str() << "self._reqs = {}" << endl
               << indent() << indent_str() << "return" << endl
               << indent() << "tr = TTransport.TMemoryBuffer(frame)" << endl
               << indent() << "iprot = self._iprot_factory.getProtocol(tr)" << endl
               << indent() << "(fname, mtype, rseqid) = iprot.readMessageBegin()" << endl
               << indent() << "method = getattr(self, 'recv_' + fname)" << endl
               << indent() << "future = self._reqs.pop(rseqid, None)" << endl
               << indent() << "if not future:" << endl
               << indent() << indent_str() << "# future has already been discarded" << endl
               << indent() << indent_str() << "continue" << endl
               << indent() << "try:" << endl
               << indent() << indent_str() << "result = method(iprot, mtype, rseqid)" << endl
               << indent() << "except Exception as e:" << endl
               << indent() << indent_str() << "future.set_exception(e)" << endl
               << indent() << "else:" << endl
               << indent() << indent_str() << "future.set_result(result)" << endl;
    indent_down();
    indent_down();
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* arg_struct = (*f_iter)->get_arglist();
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    string funname = (*f_iter)->get_name();

    f_service_ << endl;
    // Open function
    indent(f_service_) << "def " << function_signature(*f_iter, false) << ":" << endl;
    indent_up();
    generate_python_docstring(f_service_, (*f_iter));
    if (gen_twisted_) {
      indent(f_service_) << "seqid = self._seqid = self._seqid + 1" << endl;
      indent(f_service_) << "self._reqs[seqid] = defer.Deferred()" << endl << endl;
      indent(f_service_) << "d = defer.maybeDeferred(self.send_" << funname;

    } else if (gen_tornado_) {
      indent(f_service_) << "self._seqid += 1" << endl;
      if (!(*f_iter)->is_oneway()) {
        indent(f_service_) << "future = self._reqs[self._seqid] = concurrent.Future()" << endl;
      }
      indent(f_service_) << "self.send_" << funname << "(";

    } else {
      indent(f_service_) << "self.send_" << funname << "(";
    }

    bool first = true;
    if (gen_twisted_) {
      // we need a leading comma if there are args, since it's called as maybeDeferred(funcname,
      // arg)
      first = false;
    }
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << (*fld_iter)->get_name();
    }

    f_service_ << ")" << endl;

    if (!(*f_iter)->is_oneway()) {
      if (gen_twisted_) {
        // nothing. See the next block.
      } else if (gen_tornado_) {
        indent(f_service_) << "return future" << endl;
      } else {
        f_service_ << indent();
        if (!(*f_iter)->get_returntype()->is_void()) {
          f_service_ << "return ";
        }
        f_service_ << "self.recv_" << funname << "()" << endl;
      }
    }
    indent_down();

    if (gen_twisted_) {
      // This block injects the body of the send_<> method for twisted (and a cb/eb pair)
      indent_up();
      indent(f_service_) << "d.addCallbacks(" << endl;

      indent_up();
      f_service_ << indent() << "callback=self.cb_send_" << funname << "," << endl << indent()
                 << "callbackArgs=(seqid,)," << endl << indent() << "errback=self.eb_send_"
                 << funname << "," << endl << indent() << "errbackArgs=(seqid,))" << endl;
      indent_down();

      indent(f_service_) << "return d" << endl;
      indent_down();
      f_service_ << endl;

      indent(f_service_) << "def cb_send_" << funname << "(self, _, seqid):" << endl;
      indent_up();
      if ((*f_iter)->is_oneway()) {
        // if one-way, fire the deferred & remove it from _reqs
        f_service_ << indent() << "d = self._reqs.pop(seqid)" << endl << indent()
                   << "d.callback(None)" << endl << indent() << "return d" << endl;
      } else {
        f_service_ << indent() << "return self._reqs[seqid]" << endl;
      }
      indent_down();
      f_service_ << endl;

      // add an errback to fail the request if the call to send_<> raised an exception
      indent(f_service_) << "def eb_send_" << funname << "(self, f, seqid):" << endl;
      indent_up();
      f_service_ << indent() << "d = self._reqs.pop(seqid)" << endl << indent() << "d.errback(f)"
                 << endl << indent() << "return d" << endl;
      indent_down();
    }

    f_service_ << endl;
    indent(f_service_) << "def send_" << function_signature(*f_iter, false) << ":" << endl;
    indent_up();

    std::string argsname = (*f_iter)->get_name() + "_args";
    std::string messageType = (*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL";

    // Serialize the request header
    if (gen_twisted_ || gen_tornado_) {
      f_service_ << indent() << "oprot = self._oprot_factory.getProtocol(self._transport)" << endl
                 << indent() << "oprot.writeMessageBegin('" << (*f_iter)->get_name() << "', "
                 << messageType << ", self._seqid)" << endl;
    } else {
      f_service_ << indent() << "self._oprot.writeMessageBegin('" << (*f_iter)->get_name() << "', "
                 << messageType << ", self._seqid)" << endl;
    }

    f_service_ << indent() << "args = " << argsname << "()" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args." << (*fld_iter)->get_name() << " = "
                 << (*fld_iter)->get_name() << endl;
    }

    // Write to the stream
    if (gen_twisted_ || gen_tornado_) {
      f_service_ << indent() << "args.write(oprot)" << endl << indent() << "oprot.writeMessageEnd()"
                 << endl << indent() << "oprot.trans.flush()" << endl;
    } else {
      f_service_ << indent() << "args.write(self._oprot)" << endl << indent()
                 << "self._oprot.writeMessageEnd()" << endl << indent()
                 << "self._oprot.trans.flush()" << endl;
    }

    indent_down();

    if (!(*f_iter)->is_oneway()) {
      std::string resultname = (*f_iter)->get_name() + "_result";
      // Open function
      f_service_ << endl;
      if (gen_twisted_ || gen_tornado_) {
        f_service_ << indent() << "def recv_" << (*f_iter)->get_name()
                   << "(self, iprot, mtype, rseqid):" << endl;
      } else {
        t_struct noargs(program_);
        t_function recv_function((*f_iter)->get_returntype(),
                                 string("recv_") + (*f_iter)->get_name(),
                                 &noargs);
        f_service_ << indent() << "def " << function_signature(&recv_function) << ":" << endl;
      }
      indent_up();

      // TODO(mcslee): Validate message reply here, seq ids etc.

      if (gen_twisted_) {
        f_service_ << indent() << "d = self._reqs.pop(rseqid)" << endl;
      } else if (gen_tornado_) {
      } else {
        f_service_ << indent() << "iprot = self._iprot" << endl << indent()
                   << "(fname, mtype, rseqid) = iprot.readMessageBegin()" << endl;
      }

      f_service_ << indent() << "if mtype == TMessageType.EXCEPTION:" << endl
                 << indent() << indent_str() << "x = TApplicationException()" << endl;

      if (gen_twisted_) {
        f_service_ << indent() << indent_str() << "x.read(iprot)" << endl << indent()
                   << indent_str() << "iprot.readMessageEnd()" << endl << indent() << indent_str() << "return d.errback(x)"
                   << endl << indent() << "result = " << resultname << "()" << endl << indent()
                   << "result.read(iprot)" << endl << indent() << "iprot.readMessageEnd()" << endl;
      } else {
        f_service_ << indent() << indent_str() << "x.read(iprot)" << endl << indent()
                   << indent_str() << "iprot.readMessageEnd()" << endl << indent() << indent_str() << "raise x" << endl
                   << indent() << "result = " << resultname << "()" << endl << indent()
                   << "result.read(iprot)" << endl << indent() << "iprot.readMessageEnd()" << endl;
      }

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "if result.success is not None:" << endl;
        if (gen_twisted_) {
          f_service_ << indent() << indent_str() << "return d.callback(result.success)" << endl;
        } else {
          f_service_ << indent() << indent_str() << "return result.success" << endl;
        }
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "if result." << xname << " is not None:" << endl;
        if (gen_twisted_) {
          f_service_ << indent() << indent_str() << "return d.errback(result." << xname << ")"
                     << endl;
        } else {
          f_service_ << indent() << indent_str() << "raise result." << xname << "" << endl;
        }
      }

      // Careful, only return _result if not a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        if (gen_twisted_) {
          f_service_ << indent() << "return d.callback(None)" << endl;
        } else {
          f_service_ << indent() << "return" << endl;
        }
      } else {
        if (gen_twisted_) {
          f_service_
              << indent()
              << "return d.errback(TApplicationException(TApplicationException.MISSING_RESULT, \""
              << (*f_iter)->get_name() << " failed: unknown result\"))" << endl;
        } else {
          f_service_ << indent()
                     << "raise TApplicationException(TApplicationException.MISSING_RESULT, \""
                     << (*f_iter)->get_name() << " failed: unknown result\")" << endl;
        }
      }

      // Close function
      indent_down();
    }
  }

  indent_down();
}